

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON::GetFileStats(wchar_t *filename,size_t *filesize,time_t *create_time,time_t *lastmodify_time
                     )

{
  FILE *fp_00;
  FILE *fp;
  bool rc;
  time_t *lastmodify_time_local;
  time_t *create_time_local;
  size_t *filesize_local;
  wchar_t *filename_local;
  
  fp._7_1_ = false;
  if (filesize != (size_t *)0x0) {
    *filesize = 0;
  }
  if (create_time != (time_t *)0x0) {
    *create_time = 0;
  }
  if (lastmodify_time != (time_t *)0x0) {
    *lastmodify_time = 0;
  }
  if (((filename != (wchar_t *)0x0) && (*filename != L'\0')) &&
     (fp_00 = OpenFile(filename,L"rb"), fp_00 != (FILE *)0x0)) {
    fp._7_1_ = GetFileStats(fp_00,filesize,create_time,lastmodify_time);
    CloseFile(fp_00);
  }
  return fp._7_1_;
}

Assistant:

bool ON::GetFileStats( const wchar_t* filename,
                       size_t* filesize,
                       time_t* create_time,
                       time_t* lastmodify_time
                      )
{
  bool rc = false;

  if (filesize)
    *filesize = 0;
  if (create_time)
    *create_time = 0;
  if (lastmodify_time)
    *lastmodify_time = 0;

  if ( filename && filename[0] )
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( fp )
    {
      rc = ON::GetFileStats(fp,filesize,create_time,lastmodify_time);
      ON::CloseFile(fp);
    }
  }

  return rc;
}